

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hotp.c
# Opt level: O0

uint32_t dynamic_truncate(uint8_t *hmac)

{
  uint uVar1;
  int o;
  uint8_t *hmac_local;
  
  uVar1 = hmac[0x13] & 0xf;
  return (hmac[(int)uVar1] & 0x7f) << 0x18 | (uint)hmac[(int)(uVar1 + 1)] << 0x10 |
         (uint)hmac[(int)(uVar1 + 2)] << 8 | (uint)hmac[(int)(uVar1 + 3)];
}

Assistant:

static uint32_t dynamic_truncate(uint8_t hmac[20]) {
  int o = hmac[19] & 0x0F;

  return ((uint32_t)(hmac[o] & 0x7F)) << 24 |
         ((uint32_t)(hmac[o + 1] & 0xff)) << 16 | (hmac[o + 2] & 0xff) << 8 |
         (hmac[o + 3] & 0xff);
}